

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall midi_container::split_by_instrument_changes(midi_container *this,split_callback cb)

{
  reference p_in;
  size_t sVar1;
  midi_event *p_event;
  size_t sVar2;
  midi_event *pmVar3;
  long lVar4;
  reference pvVar5;
  size_type p_data_count;
  vector<midi_track,_std::allocator<midi_track>_> *this_00;
  midi_track local_188;
  midi_event local_170;
  uchar *local_130;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  uchar *local_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string name;
  midi_event *ev;
  int local_c0;
  int j_1;
  int i_1;
  uint8_t instrument;
  uint8_t bank_lsb;
  uint8_t bank_msb;
  unsigned_long timestamp;
  midi_event *event;
  unsigned_long l;
  unsigned_long k;
  midi_track program_change;
  midi_track output_track;
  __normal_iterator<midi_track_*,_std::vector<midi_track,_std::allocator<midi_track>_>_> local_50;
  const_iterator local_48;
  undefined1 local_40 [8];
  midi_track source_track;
  unsigned_long j;
  unsigned_long i;
  split_callback cb_local;
  midi_container *this_local;
  
  if (this->m_form == 1) {
    j = 0;
    source_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
    for (; j < source_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; j = j + 1) {
      this_00 = &this->m_tracks;
      p_in = std::vector<midi_track,_std::allocator<midi_track>_>::operator[](this_00,0);
      midi_track::midi_track((midi_track *)local_40,p_in);
      local_50._M_current =
           (midi_track *)std::vector<midi_track,_std::allocator<midi_track>_>::begin(this_00);
      __gnu_cxx::
      __normal_iterator<midi_track_const*,std::vector<midi_track,std::allocator<midi_track>>>::
      __normal_iterator<midi_track*>
                ((__normal_iterator<midi_track_const*,std::vector<midi_track,std::allocator<midi_track>>>
                  *)&local_48,&local_50);
      std::vector<midi_track,_std::allocator<midi_track>_>::erase(this_00,local_48);
      midi_track::midi_track
                ((midi_track *)
                 &program_change.m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      midi_track::midi_track((midi_track *)&k);
      l = 0;
      sVar1 = midi_track::get_count((midi_track *)local_40);
      for (; l < sVar1; l = l + 1) {
        p_event = midi_track::operator[]((midi_track *)local_40,l);
        if ((p_event->m_type == program_change) ||
           ((p_event->m_type == control_change &&
            ((p_event->m_data[0] == '\0' || (p_event->m_data[0] == ' ')))))) {
          midi_track::add_event((midi_track *)&k,p_event);
        }
        else {
          sVar2 = midi_track::get_count((midi_track *)&k);
          if (sVar2 != 0) {
            sVar2 = midi_track::get_count
                              ((midi_track *)
                               &program_change.m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            if (sVar2 != 0) {
              std::vector<midi_track,_std::allocator<midi_track>_>::push_back
                        (&this->m_tracks,
                         (value_type *)
                         &program_change.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
            midi_track::operator=
                      ((midi_track *)
                       &program_change.m_events.
                        super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(midi_track *)&k);
            if (cb != (split_callback)0x0) {
              _i_1 = 0;
              j_1._3_1_ = '\0';
              j_1._2_1_ = '\0';
              j_1._1_1_ = '\0';
              local_c0 = 0;
              sVar2 = midi_track::get_count((midi_track *)&k);
              for (; local_c0 < (int)sVar2; local_c0 = local_c0 + 1) {
                pmVar3 = midi_track::operator[]((midi_track *)&k,(long)local_c0);
                if (pmVar3->m_type == program_change) {
                  j_1._1_1_ = pmVar3->m_data[0];
                }
                else if (pmVar3->m_data[0] == '\0') {
                  j_1._3_1_ = pmVar3->m_data[1];
                }
                else {
                  j_1._2_1_ = pmVar3->m_data[1];
                }
                if (_i_1 < pmVar3->m_timestamp) {
                  _i_1 = pmVar3->m_timestamp;
                }
              }
              (*cb)((string *)
                    &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,j_1._3_1_,j_1._2_1_,j_1._1_1_);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
              lVar4 = std::__cxx11::string::length();
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
                         lVar4 + 2);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108
                                  ,0);
              *pvVar5 = 0xff;
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108
                                  ,1);
              *pvVar5 = '\x03';
              local_110._M_current = (char *)std::__cxx11::string::begin();
              local_118._M_current = (char *)std::__cxx11::string::end();
              local_128._M_current =
                   (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_108);
              local_120 = (uchar *)__gnu_cxx::
                                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   ::operator+(&local_128,2);
              local_130 = (uchar *)std::
                                   copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                             (local_110,local_118,
                                              (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               )local_120);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108
                                  ,0);
              p_data_count = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        local_108);
              midi_event::midi_event(&local_170,_i_1,extended,0,pvVar5,p_data_count);
              midi_track::add_event
                        ((midi_track *)
                         &program_change.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&local_170);
              midi_event::~midi_event(&local_170);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
              std::__cxx11::string::~string
                        ((string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            midi_track::midi_track(&local_188);
            midi_track::operator=((midi_track *)&k,&local_188);
            midi_track::~midi_track(&local_188);
          }
          midi_track::add_event
                    ((midi_track *)
                     &program_change.m_events.
                      super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,p_event);
        }
      }
      sVar1 = midi_track::get_count
                        ((midi_track *)
                         &program_change.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar1 != 0) {
        std::vector<midi_track,_std::allocator<midi_track>_>::push_back
                  (&this->m_tracks,
                   (value_type *)
                   &program_change.m_events.
                    super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      midi_track::~midi_track((midi_track *)&k);
      midi_track::~midi_track
                ((midi_track *)
                 &program_change.m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      midi_track::~midi_track((midi_track *)local_40);
    }
  }
  return;
}

Assistant:

void midi_container::split_by_instrument_changes(split_callback cb)
{
    if (m_form != 1) /* This would literally die on anything else */
        return;

    for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
    {
        midi_track source_track = m_tracks[0];

        m_tracks.erase(m_tracks.begin());

        midi_track output_track;
        midi_track program_change;

        for (unsigned long k = 0, l = source_track.get_count(); k < l; ++k)
        {
            const midi_event & event = source_track[ k ];
            if ( event.m_type == midi_event::program_change ||
               ( event.m_type == midi_event::control_change &&
                 (event.m_data[0] == 0 || event.m_data[0] == 0x20)))
            {
                program_change.add_event( event );
            }
            else
            {
                if (program_change.get_count())
                {
                    if (output_track.get_count())
                        m_tracks.push_back( output_track );
                    output_track = program_change;
					if (cb)
					{
						unsigned long timestamp = 0;
						uint8_t bank_msb = 0, bank_lsb = 0, instrument = 0;
						for (int i = 0, j = program_change.get_count(); i < j; ++i)
						{
							const midi_event & ev = program_change[i];
							if (ev.m_type == midi_event::program_change)
								instrument = ev.m_data[0];
							else if (ev.m_data[0] == 0)
								bank_msb = ev.m_data[1];
							else
								bank_lsb = ev.m_data[1];
							if (ev.m_timestamp > timestamp)
								timestamp = ev.m_timestamp;
						}

						std::string name = cb(bank_msb, bank_lsb, instrument);

						std::vector<uint8_t> data;

						data.resize(name.length() + 2);

						data[0] = 0xFF;
						data[1] = 0x03;

						std::copy(name.begin(), name.end(), data.begin() + 2);

						output_track.add_event(midi_event(timestamp, midi_event::extended, 0, &data[0], data.size()));
					}
					program_change = midi_track();
                }
                output_track.add_event( event );
            }
        }

        if (output_track.get_count())
            m_tracks.push_back(output_track);
    }
}